

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_conv_transpose_1d(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int p0,int d0)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  char *file;
  int64_t ne [4];
  long local_38;
  int64_t local_30;
  long local_28;
  undefined8 local_20;
  
  if ((b->ne[2] == 1) && (b->ne[3] == 1)) {
    if (a->ne[2] == b->ne[1]) {
      if (a->ne[3] == 1) {
        if (p0 == 0) {
          if (d0 == 1) {
            local_38 = (long)s0 * (b->ne[0] + -1) + a->ne[0];
            local_30 = a->ne[1];
            local_20 = 1;
            local_28 = b->ne[2];
            pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_38,(ggml_tensor *)0x0,0);
            if (pgVar1 != (ggml_tensor *)0x0) {
              pgVar1->op_params[0] = s0;
              pgVar1->op_params[1] = 0;
              pgVar1->op_params[2] = 1;
              pgVar1->op = GGML_OP_CONV_TRANSPOSE_1D;
              pgVar1->src[0] = a;
              pgVar1->src[1] = b;
              return pgVar1;
            }
            file = 
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
            pcVar2 = "tensor != NULL";
            line = 0x70;
          }
          else {
            file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
            pcVar2 = "d0 == 1";
            line = 0xf84;
          }
        }
        else {
          file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
          pcVar2 = "p0 == 0";
          line = 0xf83;
        }
      }
      else {
        file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
        pcVar2 = "a->ne[3] == 1";
        line = 0xf81;
      }
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar2 = "a->ne[2] == b->ne[1]";
      line = 0xf80;
    }
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "ggml_is_matrix(b)";
    line = 0xf7f;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

ggml_tensor * ggml_conv_transpose_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   p0,
        int                   d0) {
    GGML_ASSERT(ggml_is_matrix(b));
    GGML_ASSERT(a->ne[2] == b->ne[1]);
    GGML_ASSERT(a->ne[3] == 1);

    GGML_ASSERT(p0 == 0);
    GGML_ASSERT(d0 == 1);

    const int64_t ne[4] = {
        ggml_calc_conv_transpose_1d_output_size(b->ne[0], a->ne[0], s0, 0 /*p0*/, 1 /*d0*/),
        a->ne[1], b->ne[2], 1,
    };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { s0, p0, d0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CONV_TRANSPOSE_1D;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}